

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

void updateWindowMode(_GLFWwindow *window)

{
  Window WVar1;
  Atom AVar2;
  Atom AVar3;
  unsigned_long uVar4;
  XSetWindowAttributes attributes;
  
  AVar2 = _glfw.x11.NET_WM_FULLSCREEN_MONITORS;
  if (window->monitor == (_GLFWmonitor *)0x0) {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      XDeleteProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_FULLSCREEN_MONITORS);
    }
    AVar3 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar2 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.override_redirect = 0;
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 0;
    }
    else {
      WVar1 = (window->x11).handle;
      memset(&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar2;
      attributes._64_8_ = AVar3;
      attributes.do_not_propagate_mask = 1;
      attributes._32_8_ = WVar1;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&attributes);
    }
    XDeleteProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR);
  }
  else {
    if (_glfw.x11.NET_WM_FULLSCREEN_MONITORS != 0 && _glfw.x11.xinerama.available != 0) {
      uVar4 = (unsigned_long)(window->monitor->x11).index;
      WVar1 = (window->x11).handle;
      memset(&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar2;
      attributes._32_8_ = WVar1;
      attributes.backing_pixel = uVar4;
      attributes._64_8_ = uVar4;
      attributes.event_mask = uVar4;
      attributes.do_not_propagate_mask = uVar4;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&attributes);
    }
    AVar3 = _glfw.x11.NET_WM_STATE_FULLSCREEN;
    AVar2 = _glfw.x11.NET_WM_STATE;
    if (_glfw.x11.NET_WM_STATE_FULLSCREEN == 0 || _glfw.x11.NET_WM_STATE == 0) {
      attributes.override_redirect = 1;
      XChangeWindowAttributes(_glfw.x11.display,(window->x11).handle,0x200);
      (window->x11).overrideRedirect = 1;
    }
    else {
      WVar1 = (window->x11).handle;
      memset(&attributes,0,0xc0);
      attributes.background_pixmap = CONCAT44(attributes.background_pixmap._4_4_,0x21);
      attributes.backing_planes._0_4_ = 0x20;
      attributes._40_8_ = AVar2;
      attributes.backing_pixel = 1;
      attributes._64_8_ = AVar3;
      attributes.do_not_propagate_mask = 1;
      attributes._32_8_ = WVar1;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,&attributes);
    }
    attributes.background_pixmap = 1;
    XChangeProperty(_glfw.x11.display,(window->x11).handle,_glfw.x11.NET_WM_BYPASS_COMPOSITOR,6,0x20
                    ,0,&attributes,1);
  }
  return;
}

Assistant:

static void updateWindowMode(_GLFWwindow* window)
{
    if (window->monitor)
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_FULLSCREEN_MONITORS,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          window->monitor->x11.index,
                          0);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_ADD,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            // This is the butcher's way of removing window decorations
            // Setting the override-redirect attribute on a window makes the
            // window manager ignore the window completely (ICCCM, section 4)
            // The good thing is that this makes undecorated full screen windows
            // easy to do; the bad thing is that we have to do everything
            // manually and some things (like iconify/restore) won't work at
            // all, as those are tasks usually performed by the window manager

            XSetWindowAttributes attributes;
            attributes.override_redirect = True;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_TRUE;
        }

        // Enable compositor bypass
        {
            const unsigned long value = 1;

            XChangeProperty(_glfw.x11.display,  window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR, XA_CARDINAL, 32,
                            PropModeReplace, (unsigned char*) &value, 1);
        }
    }
    else
    {
        if (_glfw.x11.xinerama.available &&
            _glfw.x11.NET_WM_FULLSCREEN_MONITORS)
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_FULLSCREEN_MONITORS);
        }

        if (_glfw.x11.NET_WM_STATE && _glfw.x11.NET_WM_STATE_FULLSCREEN)
        {
            sendEventToWM(window,
                          _glfw.x11.NET_WM_STATE,
                          _NET_WM_STATE_REMOVE,
                          _glfw.x11.NET_WM_STATE_FULLSCREEN,
                          0, 1, 0);
        }
        else
        {
            XSetWindowAttributes attributes;
            attributes.override_redirect = False;
            XChangeWindowAttributes(_glfw.x11.display,
                                    window->x11.handle,
                                    CWOverrideRedirect,
                                    &attributes);

            window->x11.overrideRedirect = GLFW_FALSE;
        }

        // Disable compositor bypass
        {
            XDeleteProperty(_glfw.x11.display, window->x11.handle,
                            _glfw.x11.NET_WM_BYPASS_COMPOSITOR);
        }
    }
}